

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessGenVertexOrderQueryCase::iterate
          (TessGenVertexOrderQueryCase *this)

{
  TestLog *pTVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  int iVar5;
  undefined4 extraout_var;
  ContextInfo *__dest;
  Context *__dest_00;
  string *description;
  char *globalLayouts;
  char *globalLayouts_00;
  long lVar6;
  long lVar7;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  ShaderProgram program;
  Context *local_3e8;
  TestContext *local_3e0;
  Context local_3d8;
  _Base_ptr local_3c0;
  undefined1 local_3b8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Base_ptr local_378;
  value_type local_370;
  uint local_350 [2];
  value_type local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  long local_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  uint local_260;
  value_type local_258;
  CallLogWrapper local_238;
  undefined1 local_220 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_190;
  undefined1 local_170 [32];
  ResultCollector local_150;
  undefined1 local_100 [152];
  GLuint local_68;
  bool local_40;
  
  pTVar1 = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_150,pTVar1,(string *)local_100);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  iVar5 = (*((this->super_TessProgramQueryCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_238,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log);
  checkTessellationSupport((this->super_TessProgramQueryCase).super_TestCase.m_context);
  local_238.m_enableLog = true;
  lVar6 = 0;
  do {
    pTVar1 = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Type","");
    description = (string *)local_220;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)description,iterate::s_modes[lVar6].description,
               (allocator<char> *)local_350);
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)(local_3b8 + 0x10),pTVar1,(string *)local_100,description);
    if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
    local_2a8 = lVar6;
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    renderCtx = pCVar2->m_renderCtx;
    local_170[0x10] = 0;
    local_170._17_8_ = 0;
    local_170._0_8_ = (pointer)0x0;
    local_170[8] = 0;
    local_170._9_7_ = 0;
    memset(local_220,0,0xac);
    local_3d8.m_contextInfo = (ContextInfo *)local_3b8;
    local_378 = (_Base_ptr)0x75;
    __dest = (ContextInfo *)
             std::__cxx11::string::_M_create((ulong *)&local_3d8.m_contextInfo,(ulong)&local_378);
    p_Var4 = local_378;
    local_3b8._0_8_ = local_378;
    local_3d8.m_contextInfo = __dest;
    memcpy(__dest,
           "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(float(gl_VertexID), float(gl_VertexID / 2), 0.0, 1.0);\n}\n"
           ,0x75);
    local_3c0 = p_Var4;
    *(undefined1 *)((long)&p_Var4->_M_color + (long)&__dest->_vptr_ContextInfo) = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2c8,(_anonymous_namespace_ *)pCVar2,(Context *)local_3d8.m_contextInfo,
               (char *)description);
    local_350[0] = 0;
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_2c8._M_dataplus._M_p,
               local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + (ulong)local_350[0] * 0x18),&local_348);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    local_3e8 = &local_3d8;
    local_3b8._24_8_ = (TestContext *)0x7f;
    __dest_00 = (Context *)
                std::__cxx11::string::_M_create((ulong *)&local_3e8,(ulong)(local_3b8 + 0x18));
    uVar3 = local_3b8._24_8_;
    local_3d8.m_testCtx = (TestContext *)local_3b8._24_8_;
    local_3e8 = __dest_00;
    memcpy(__dest_00,
           "${GLSL_VERSION_DECL}\nlayout (location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n}\n"
           ,0x7f);
    local_3e0 = (TestContext *)uVar3;
    *(undefined1 *)((long)(Platform **)uVar3 + (long)&__dest_00->m_testCtx) = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2e8,(_anonymous_namespace_ *)pCVar2,local_3e8,(char *)description);
    local_378 = (_Base_ptr)CONCAT44(local_378._4_4_,1);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_2e8._M_dataplus._M_p,
               local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + ((ulong)local_378 & 0xffffffff) * 0x18),&local_370);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    (anonymous_namespace)::TessProgramQueryCase::getTessCtrlSource_abi_cxx11_
              ((string *)local_280,"layout(vertices=6) out",globalLayouts);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_308,(_anonymous_namespace_ *)pCVar2,(Context *)local_280._0_8_,
               (char *)description);
    local_3b8._24_4_ = 3;
    local_3b8._32_8_ = &local_388;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_3b8 + 0x20),local_308._M_dataplus._M_p,
               local_308._M_dataplus._M_p + local_308._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + (local_3b8._24_8_ & 0xffffffff) * 0x18),
                (value_type *)(local_3b8 + 0x20));
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    (anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
              ((string *)local_2a0,iterate::s_modes[lVar6].layout,globalLayouts_00);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_328,(_anonymous_namespace_ *)pCVar2,(Context *)local_2a0._0_8_,
               (char *)description);
    local_260 = 4;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_328._M_dataplus._M_p,
               local_328._M_dataplus._M_p + local_328._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + (ulong)local_260 * 0x18),&local_258);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)local_100,renderCtx,(ProgramSources *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((Context *)local_2a0._0_8_ != (Context *)(local_2a0 + 0x10)) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._32_8_ != &local_388) {
      operator_delete((void *)local_3b8._32_8_,local_388._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((Context *)local_280._0_8_ != (Context *)(local_280 + 0x10)) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,(ulong)((long)&(local_3d8.m_testCtx)->m_platform + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if (local_3d8.m_contextInfo != (ContextInfo *)local_3b8) {
      operator_delete(local_3d8.m_contextInfo,(ulong)((long)(_Rb_tree_color *)local_3b8._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_170);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_190);
    lVar7 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + lVar7));
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
    glu::operator<<(((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode
                    .m_testCtx)->m_log,(ShaderProgram *)local_100);
    if (local_40 == false) {
      local_220._0_8_ = local_220 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"failed to build program","");
      tcu::ResultCollector::fail(&local_150,(string *)local_220);
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
      }
    }
    else {
      gls::StateQueryUtil::verifyStateProgramInteger
                (&local_150,&local_238,local_68,0x8e78,iterate::s_modes[lVar6].order,
                 QUERY_PROGRAM_INTEGER);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
    tcu::TestLog::endSection((TestLog *)local_3b8._16_8_);
    lVar6 = local_2a8 + 1;
  } while (lVar6 != 3);
  tcu::ResultCollector::setTestContextResult
            (&local_150,
             (this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx);
  glu::CallLogWrapper::~CallLogWrapper(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.m_message._M_dataplus._M_p != &local_150.m_message.field_2) {
    operator_delete(local_150.m_message._M_dataplus._M_p,
                    local_150.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.m_prefix._M_dataplus._M_p != &local_150.m_prefix.field_2) {
    operator_delete(local_150.m_prefix._M_dataplus._M_p,
                    local_150.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

TessGenVertexOrderQueryCase::IterateResult TessGenVertexOrderQueryCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	static const struct
	{
		const char* description;
		const char* layout;
		glw::GLenum order;
	} s_modes[] =
	{
		{ "Default order",	"layout(triangles) in",			GL_CCW	},
		{ "CW order",		"layout(triangles, cw) in",		GL_CW	},
		{ "CCW order",		"layout(triangles, ccw) in",	GL_CCW	},
	};

	checkTessellationSupport(m_context);
	gl.enableLogging(true);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_modes); ++ndx)
	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Type", s_modes[ndx].description);

		glu::ShaderProgram program (m_context.getRenderContext(), glu::ProgramSources()
																	<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																	<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																	<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource("layout(vertices=6) out").c_str()))
																	<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource(s_modes[ndx].layout).c_str())));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			result.fail("failed to build program");
		else
			verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, s_modes[ndx].order, QUERY_PROGRAM_INTEGER);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}